

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_sha256_finalize(secp256k1_sha256 *hash,uchar *out32)

{
  secp256k1_sha256 *in_RSI;
  long in_RDI;
  int i;
  uchar sizedesc [8];
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  uchar *in_stack_ffffffffffffffe8;
  
  if (0x1fffffffffffffff < *(ulong *)(in_RDI + 0x60)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/hash_impl.h"
            ,0x96,"test condition failed: hash->bytes < ((uint64_t)1 << 61)");
    abort();
  }
  secp256k1_write_be32(&stack0xffffffffffffffe8,(uint32_t)(*(ulong *)(in_RDI + 0x60) >> 0x1d));
  secp256k1_write_be32(&stack0xffffffffffffffec,(uint32_t)(*(long *)(in_RDI + 0x60) << 3));
  secp256k1_sha256_write
            (in_RSI,in_stack_ffffffffffffffe8,
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  secp256k1_sha256_write
            (in_RSI,in_stack_ffffffffffffffe8,
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
    secp256k1_write_be32
              ((uchar *)((long)in_RSI->s + (long)(iVar1 << 2)),
               *(uint32_t *)(in_RDI + (long)iVar1 * 4));
    *(undefined4 *)(in_RDI + (long)iVar1 * 4) = 0;
  }
  return;
}

Assistant:

static void secp256k1_sha256_finalize(secp256k1_sha256 *hash, unsigned char *out32) {
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    int i;
    /* The maximum message size of SHA256 is 2^64-1 bits. */
    VERIFY_CHECK(hash->bytes < ((uint64_t)1 << 61));
    secp256k1_write_be32(&sizedesc[0], hash->bytes >> 29);
    secp256k1_write_be32(&sizedesc[4], hash->bytes << 3);
    secp256k1_sha256_write(hash, pad, 1 + ((119 - (hash->bytes % 64)) % 64));
    secp256k1_sha256_write(hash, sizedesc, 8);
    for (i = 0; i < 8; i++) {
        secp256k1_write_be32(&out32[4*i], hash->s[i]);
        hash->s[i] = 0;
    }
}